

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O2

void __kmp_api_omp_get_partition_place_nums(int *place_nums)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  if (__kmp_affin_mask_size != 0) {
    iVar2 = __kmp_get_global_thread_id_reg();
    uVar1 = (__kmp_threads[iVar2]->th).th_first_place;
    uVar3 = (__kmp_threads[iVar2]->th).th_last_place;
    if (-1 < (int)(uVar1 | uVar3)) {
      uVar4 = uVar3;
      if (uVar1 < uVar3) {
        uVar4 = uVar1;
      }
      if (uVar3 < uVar1) {
        uVar3 = uVar1;
      }
      for (; (int)uVar4 <= (int)uVar3; uVar4 = uVar4 + 1) {
        *place_nums = uVar4;
        place_nums = (int *)((uint *)place_nums + 1);
      }
    }
  }
  return;
}

Assistant:

void
    FTN_STDCALL KMP_EXPAND_NAME(FTN_GET_PARTITION_PLACE_NUMS)(int *place_nums) {
#if defined(KMP_STUB) || !KMP_AFFINITY_SUPPORTED
// Nothing.
#else
  int i, gtid, place_num, first_place, last_place, start, end;
  kmp_info_t *thread;
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  if (!KMP_AFFINITY_CAPABLE())
    return;
  gtid = __kmp_entry_gtid();
  thread = __kmp_thread_from_gtid(gtid);
  first_place = thread->th.th_first_place;
  last_place = thread->th.th_last_place;
  if (first_place < 0 || last_place < 0)
    return;
  if (first_place <= last_place) {
    start = first_place;
    end = last_place;
  } else {
    start = last_place;
    end = first_place;
  }
  for (i = 0, place_num = start; place_num <= end; ++place_num, ++i) {
    place_nums[i] = place_num;
  }
#endif
}